

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::StyleSheet>::copyAppend
          (QGenericArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  qsizetype *pqVar1;
  StyleSheet *pSVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  Data *pDVar8;
  Data *pDVar9;
  int iVar10;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::StyleSheet>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::StyleSheet>).size;
      pDVar4 = (b->styleRules).d.d;
      pSVar2[lVar3].styleRules.d.d = pDVar4;
      pSVar2[lVar3].styleRules.d.ptr = (b->styleRules).d.ptr;
      pSVar2[lVar3].styleRules.d.size = (b->styleRules).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar5 = (b->mediaRules).d.d;
      pSVar2[lVar3].mediaRules.d.d = pDVar5;
      pSVar2[lVar3].mediaRules.d.ptr = (b->mediaRules).d.ptr;
      pSVar2[lVar3].mediaRules.d.size = (b->mediaRules).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar6 = (b->pageRules).d.d;
      pSVar2[lVar3].pageRules.d.d = pDVar6;
      pSVar2[lVar3].pageRules.d.ptr = (b->pageRules).d.ptr;
      pSVar2[lVar3].pageRules.d.size = (b->pageRules).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (b->animationRules).d.d;
      pSVar2[lVar3].animationRules.d.d = pDVar7;
      pSVar2[lVar3].animationRules.d.ptr = (b->animationRules).d.ptr;
      pSVar2[lVar3].animationRules.d.size = (b->animationRules).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar8 = (b->importRules).d.d;
      pSVar2[lVar3].importRules.d.d = pDVar8;
      pSVar2[lVar3].importRules.d.ptr = (b->importRules).d.ptr;
      pSVar2[lVar3].importRules.d.size = (b->importRules).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar10 = b->depth;
      pSVar2[lVar3].origin = b->origin;
      pSVar2[lVar3].depth = iVar10;
      pDVar9 = (b->nameIndex).d;
      pSVar2[lVar3].nameIndex.d = pDVar9;
      pSVar2[lVar3].nameIndex.m_size = (b->nameIndex).m_size;
      if ((pDVar9 != (Data *)0x0) && (*(int *)pDVar9 != -1)) {
        LOCK();
        *(int *)pDVar9 = *(int *)pDVar9 + 1;
        UNLOCK();
      }
      pDVar9 = (b->idIndex).d;
      pSVar2[lVar3].idIndex.d = pDVar9;
      pSVar2[lVar3].idIndex.m_size = (b->idIndex).m_size;
      if ((pDVar9 != (Data *)0x0) && (*(int *)pDVar9 != -1)) {
        LOCK();
        *(int *)pDVar9 = *(int *)pDVar9 + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::StyleSheet>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }